

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall
QTreeView::selectionChanged(QTreeView *this,QItemSelection *selected,QItemSelection *deselected)

{
  QTreeViewPrivate *this_00;
  char cVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QModelIndex> local_a0;
  Data *local_88;
  QModelIndex *pQStack_80;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_78;
  QModelIndex local_68;
  code *local_50;
  quintptr qStack_48;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_40;
  int local_38;
  undefined4 uStack_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::selectionChanged((QAbstractItemView *)this,selected,deselected);
  cVar1 = QAccessible::isActive();
  if (cVar1 != '\0') {
    this_00 = *(QTreeViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    QItemSelection::indexes();
    local_50 = (code *)0xffffffffffffffff;
    qStack_48 = 0;
    tStack_40.ptr = (QAbstractItemModel *)0x0;
    if (local_78.ptr == (QAbstractItemModel *)0x0) {
      pQStack_80 = (QModelIndex *)&local_50;
    }
    local_68._0_8_ = *(undefined8 *)pQStack_80;
    local_68.i = pQStack_80->i;
    local_68.m.ptr = (pQStack_80->m).ptr;
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&local_88);
    if (((-1 < local_68.r) && (-1 < (long)local_68._0_8_)) &&
       (local_68.m.ptr != (QAbstractItemModel *)0x0)) {
      iVar2 = QTreeViewPrivate::accessibleTree2Index(this_00,&local_68);
      local_50 = QFont::strikeOut;
      qStack_48 = 0xaaaaaaaa00008007;
      _local_38 = CONCAT44(0xaaaaaaaa,iVar2);
      tStack_40.ptr = (QAbstractItemModel *)this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_50);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_50);
    }
    QItemSelection::indexes();
    local_50 = (code *)0xffffffffffffffff;
    qStack_48 = 0;
    tStack_40.ptr = (QAbstractItemModel *)0x0;
    if (local_a0.size == 0) {
      local_a0.ptr = (QModelIndex *)&local_50;
    }
    local_88 = *(Data **)local_a0.ptr;
    pQStack_80 = (QModelIndex *)(local_a0.ptr)->i;
    local_78.ptr = ((local_a0.ptr)->m).ptr;
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_a0);
    if (((-1 < (int)local_88) && (-1 < (long)local_88)) &&
       (local_78.ptr != (QAbstractItemModel *)0x0)) {
      iVar2 = QTreeViewPrivate::accessibleTree2Index(this_00,(QModelIndex *)&local_88);
      local_50 = QFont::strikeOut;
      qStack_48 = 0xaaaaaaaa00008008;
      _local_38 = CONCAT44(0xaaaaaaaa,iVar2);
      tStack_40.ptr = (QAbstractItemModel *)this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_50);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::selectionChanged(const QItemSelection &selected,
                                 const QItemSelection &deselected)
{
    QAbstractItemView::selectionChanged(selected, deselected);
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        Q_D(QTreeView);

        // ### does not work properly for selection ranges.
        QModelIndex sel = selected.indexes().value(0);
        if (sel.isValid()) {
            int entry = d->accessibleTree2Index(sel);
            Q_ASSERT(entry >= 0);
            QAccessibleEvent event(this, QAccessible::SelectionAdd);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
        QModelIndex desel = deselected.indexes().value(0);
        if (desel.isValid()) {
            int entry = d->accessibleTree2Index(desel);
            Q_ASSERT(entry >= 0);
            QAccessibleEvent event(this, QAccessible::SelectionRemove);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
    }
#endif
}